

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaBucketFree(xmlSchemaBucketPtr_conflict bucket)

{
  xmlSchemaSchemaRelationPtr pxVar1;
  long lVar2;
  xmlSchemaSchemaRelationPtr_conflict local_20;
  xmlSchemaSchemaRelationPtr_conflict cur;
  xmlSchemaSchemaRelationPtr_conflict prev;
  xmlSchemaBucketPtr_conflict bucket_local;
  
  if (bucket != (xmlSchemaBucketPtr_conflict)0x0) {
    if (bucket->globals != (xmlSchemaItemListPtr)0x0) {
      xmlSchemaComponentListFree(bucket->globals);
      xmlSchemaItemListFree(bucket->globals);
    }
    if (bucket->locals != (xmlSchemaItemListPtr)0x0) {
      xmlSchemaComponentListFree(bucket->locals);
      xmlSchemaItemListFree(bucket->locals);
    }
    if (bucket->relations != (xmlSchemaSchemaRelationPtr_conflict)0x0) {
      local_20 = bucket->relations;
      do {
        pxVar1 = local_20->next;
        (*xmlFree)(local_20);
        local_20 = pxVar1;
      } while (pxVar1 != (xmlSchemaSchemaRelationPtr)0x0);
    }
    if ((bucket->preserveDoc == 0) && (bucket->doc != (xmlDocPtr)0x0)) {
      xmlFreeDoc(bucket->doc);
    }
    if ((bucket->type == 1) &&
       (lVar2._0_4_ = bucket[1].type, lVar2._4_4_ = bucket[1].flags, lVar2 != 0)) {
      xmlSchemaFree(*(xmlSchemaPtr *)(bucket + 1));
    }
    (*xmlFree)(bucket);
  }
  return;
}

Assistant:

static void
xmlSchemaBucketFree(xmlSchemaBucketPtr bucket)
{
    if (bucket == NULL)
	return;
    if (bucket->globals != NULL) {
	xmlSchemaComponentListFree(bucket->globals);
	xmlSchemaItemListFree(bucket->globals);
    }
    if (bucket->locals != NULL) {
	xmlSchemaComponentListFree(bucket->locals);
	xmlSchemaItemListFree(bucket->locals);
    }
    if (bucket->relations != NULL) {
	xmlSchemaSchemaRelationPtr prev, cur = bucket->relations;
	do {
	    prev = cur;
	    cur = cur->next;
	    xmlFree(prev);
	} while (cur != NULL);
    }
    if ((! bucket->preserveDoc) && (bucket->doc != NULL)) {
	xmlFreeDoc(bucket->doc);
    }
    if (bucket->type == XML_SCHEMA_SCHEMA_IMPORT) {
	if (WXS_IMPBUCKET(bucket)->schema != NULL)
	    xmlSchemaFree(WXS_IMPBUCKET(bucket)->schema);
    }
    xmlFree(bucket);
}